

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week7-app3.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_color *p_Var3;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  long *plVar6;
  long lVar7;
  char *__end;
  initializer_list<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<int> __l_01;
  initializer_list<Gender> __l_02;
  vector<int,_std::allocator<int>_> v;
  vector<Gender,_std::allocator<Gender>_> vg;
  array<float,_3UL> a;
  vector<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vp;
  KeyValue p;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m1;
  allocator_type local_171;
  key_type local_170;
  vector<Gender,_std::allocator<Gender>_> local_150;
  array<float,_3UL> local_138;
  undefined1 local_128 [8];
  _Alloc_hider _Stack_120;
  _Base_ptr local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  size_t local_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined4 local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  vector<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  undefined4 local_98;
  long *local_90 [2];
  long local_80 [2];
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  Gender local_3c [3];
  
  local_98 = 10;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"ten","");
  local_128._0_4_ = 10;
  _Stack_120._M_p = (pointer)&local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&_Stack_120,"ten","");
  local_100 = CONCAT44(local_100._4_4_,0xb);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"eleven","");
  local_d8 = 0xc;
  plVar6 = local_c0;
  local_d0[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"twelve","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_128;
  std::
  vector<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_b0,__l,(allocator_type *)&local_70);
  lVar7 = -0x78;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -5;
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0);
  local_128._0_4_ = 10;
  _Stack_120._M_p = (pointer)&local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&_Stack_120,"ten","");
  local_100 = CONCAT44(local_100._4_4_,0xb);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"eleven","");
  local_d8 = 0xc;
  plVar6 = local_c0;
  local_d0[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"twelve","");
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_128;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_70,__l_00,(less<int> *)&local_170,(allocator_type *)&local_150);
  lVar7 = -0x78;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -5;
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0);
  local_118 = (_Base_ptr)0x0;
  local_128 = (undefined1  [8])0x0;
  _Stack_120._M_p = (pointer)0x0;
  local_100 = 0;
  p_Var1 = &local_70._M_impl.super__Rb_tree_header;
  local_110._M_allocated_capacity = (size_type)(string *)&_Stack_120;
  local_110._8_8_ = (string *)&_Stack_120;
  if ((_Rb_tree_header *)local_70._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var4 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      _Var2 = p_Var4[1]._M_color;
      p_Var3 = (_Rb_tree_color *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_128,(key_type *)&p_Var4[1]._M_parent);
      *p_Var3 = _Var2;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"twelve","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_128,&local_170);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,*pmVar5);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  local_150.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x200000001;
  local_150.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 3;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_150;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_170,__l_01,(allocator_type *)&local_138);
  local_150.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_150.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,4);
  if (local_170._M_string_length == local_170.field_2._M_allocated_capacity) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)&local_170,(iterator)local_170._M_string_length,
               (int *)&local_150);
  }
  else {
    *(int *)local_170._M_string_length = 4;
    local_170._M_string_length = local_170._M_string_length + 4;
  }
  local_138._M_elems[0] = 10.0;
  local_138._M_elems[1] = 20.0;
  local_138._M_elems[2] = 30.0;
  local_3c[0] = Male;
  local_3c[1] = Female;
  local_3c[2] = 0;
  __l_02._M_len = 3;
  __l_02._M_array = local_3c;
  std::vector<Gender,_std::allocator<Gender>_>::vector(&local_150,__l_02,&local_171);
  print_container<std::vector<int,_std::allocator<int>_>_>
            ((vector<int,_std::allocator<int>_> *)&local_170);
  print_container<std::array<float,_3UL>_>(&local_138);
  print_container<std::vector<Gender,_std::allocator<Gender>_>_>(&local_150);
  print_container(&local_b0);
  if (local_150.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_170._M_dataplus._M_p,
                    local_170.field_2._M_allocated_capacity - (long)local_170._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_128);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_70);
  std::
  vector<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_b0);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{

    auto p = KeyValue{10, "ten"};
    auto vp = vector<KeyValue>{
        {10, "ten"},
        {11, "eleven"},
        {12, "twelve"}
    };

    auto m1 = map<int, string>{
        {10, "ten"},
        {11, "eleven"},
        {12, "twelve"}
    };

    auto m2 = map<string, int>();
//    {
//        {"ten", 10},
//        {"eleven", 11},
//        {"twelve", 12}
//    };

//    for(auto iter=m1.begin(); iter!=m1.end(); ++iter)
//    {
//        const auto& item = *iter; // item is of type pair<int, string>
//        const auto& key = item.first;
//        const auto& value = item.second;
//        m2[value] = key;
//    }

//    for(auto iter=m1.begin(); iter!=m1.end(); ++iter)
//    {
//        const auto& [key, value] = *iter; // structured-binding
//        m2[value] = key;
//    }

    for(const auto& [key, value] : m1)
        m2[value] = key;

    cout << m2["twelve"] << endl;

    auto v = vector<int>{1, 2, 3};
    v.push_back(4);
    auto a = array<float, 3>{10.0f, 20.0f, 30.0f};
    auto vg = vector<Gender>{Male, Female, Female};
    print_container(v);
    print_container(a);
    print_container(vg);
    print_container(vp);

//    print_container(10);

    return 0;
}